

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header7.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Header7::Decode(Header7 *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  KUINT8 *local_80;
  allocator<char> local_41;
  KString local_40;
  undefined1 local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Header7 *this_local;
  
  if (!ignoreHeader) {
    local_19 = ignoreHeader;
    pKStack_18 = stream;
    stream_local = (KDataStream *)this;
    KVar1 = KDataStream::GetBufferSize(stream);
    if (KVar1 < 0xc) {
      this_00 = (KException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
      KException::KException(this_00,&local_40,2);
      __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
    }
    pKVar2 = KDataStream::operator>>(pKStack_18,&(this->super_Header6).m_ui8ProtocolVersion);
    pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Header6).m_ui8ExerciseID);
    pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Header6).m_ui8PDUType);
    pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Header6).m_ui8ProtocolFamily);
    pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->super_Header6).m_TimeStamp.super_DataTypeBase);
    pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Header6).m_ui16PDULength);
    if ((this->super_Header6).m_ui8ProtocolFamily == '\v') {
      local_80 = &(this->super_Header6).m_ui8Padding1;
    }
    else {
      local_80 = &(this->super_Header6).field_0x24;
    }
    pKVar2 = KDataStream::operator>>(pKVar2,local_80);
    KDataStream::operator>>(pKVar2,&(this->super_Header6).m_ui8Padding2);
  }
  return;
}

Assistant:

void Header7::Decode(KDataStream &stream, bool ignoreHeader /*= false*/ ) noexcept(false)
{
    if( !ignoreHeader )
    {
        if( stream.GetBufferSize() < HEADER6_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

        stream >> m_ui8ProtocolVersion
               >> m_ui8ExerciseID
               >> m_ui8PDUType
               >> m_ui8ProtocolFamily
               >> KDIS_STREAM m_TimeStamp
               >> m_ui16PDULength
               >> ( ( m_ui8ProtocolFamily == LiveEntity ) ? m_ui8Padding1 : m_PDUStatusUnion.m_ui8PDUStatus ) // LE family use the padding for the sub protocol field.
               >> m_ui8Padding2;
    }
}